

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_round_box.cxx
# Opt level: O0

void draw(int which,int x,int y,int w,int h,int inset,Fl_Color color)

{
  int x_00;
  int y_00;
  uint w_00;
  uint h_00;
  int iVar1;
  int iVar2;
  code *local_40;
  uint local_34;
  _func_void_int_int_int_int_double_double *f;
  int local_20;
  int d;
  int inset_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  int which_local;
  
  local_20 = inset;
  if (w <= inset * 2) {
    local_20 = (w + -1) / 2;
  }
  if (h <= local_20 * 2) {
    local_20 = (h + -1) / 2;
  }
  x_00 = local_20 + x;
  y_00 = local_20 + y;
  w_00 = w + local_20 * -2;
  h_00 = h + local_20 * -2;
  local_34 = h_00;
  if ((int)w_00 <= (int)h_00) {
    local_34 = w_00;
  }
  if (1 < (int)local_34) {
    fl_color(color);
    if (which == 3) {
      local_40 = fl_pie;
    }
    else {
      local_40 = fl_arc_i;
    }
    if (which < 2) {
      if (which == 0) {
        iVar1 = 0x5a;
        if ((int)w_00 <= (int)h_00) {
          iVar1 = 0xb4;
        }
        (*local_40)(0x4046800000000000,(double)iVar1,(x_00 + w_00) - local_34,y_00,local_34,local_34
                   );
        iVar1 = 0x5a;
        if ((int)w_00 <= (int)h_00) {
          iVar1 = 0xb4;
        }
        (*local_40)((double)iVar1,0x406c200000000000,x_00,(y_00 + h_00) - local_34,local_34,local_34
                   );
      }
      else {
        iVar1 = 0x10e;
        if ((int)w_00 <= (int)h_00) {
          iVar1 = 0x168;
        }
        (*local_40)(0x406c200000000000,(double)iVar1,x_00,(y_00 + h_00) - local_34,local_34,local_34
                   );
        iVar1 = 0x10e;
        if ((int)w_00 <= (int)h_00) {
          iVar1 = 0x168;
        }
        (*local_40)((double)iVar1,0x4079500000000000,(x_00 + w_00) - local_34,y_00,local_34,local_34
                   );
      }
    }
    else {
      iVar1 = -0x5a;
      if ((int)w_00 <= (int)h_00) {
        iVar1 = 0;
      }
      iVar2 = 0x5a;
      if ((int)w_00 <= (int)h_00) {
        iVar2 = 0xb4;
      }
      (*local_40)((double)iVar1,(double)iVar2,(x_00 + w_00) - local_34,y_00,local_34,local_34);
      iVar1 = 0x5a;
      if ((int)w_00 <= (int)h_00) {
        iVar1 = 0xb4;
      }
      iVar2 = 0x10e;
      if ((int)w_00 <= (int)h_00) {
        iVar2 = 0x168;
      }
      (*local_40)((double)iVar1,(double)iVar2,x_00,(y_00 + h_00) - local_34,local_34,local_34);
    }
    if (which == 3) {
      if ((int)w_00 < (int)h_00) {
        fl_rectf(x_00,y_00 + (int)local_34 / 2,w_00,h_00 - (local_34 & 0xfffffffe));
      }
      else if ((int)h_00 < (int)w_00) {
        fl_rectf(x_00 + (int)local_34 / 2,y_00,w_00 - (local_34 & 0xfffffffe),h_00);
      }
    }
    else if ((int)w_00 < (int)h_00) {
      if (which != 0) {
        fl_yxline(x_00 + w_00 + -1,y_00 + (int)local_34 / 2 + -1,
                  ((y_00 + h_00) - (int)local_34 / 2) + 1);
      }
      if (which != 1) {
        fl_yxline(x_00,y_00 + (int)local_34 / 2 + -1,((y_00 + h_00) - (int)local_34 / 2) + 1);
      }
    }
    else if ((int)h_00 < (int)w_00) {
      if (which != 0) {
        fl_xyline(x_00 + (int)local_34 / 2 + -1,y_00 + h_00 + -1,
                  ((x_00 + w_00) - (int)local_34 / 2) + 1);
      }
      if (which != 1) {
        fl_xyline(x_00 + (int)local_34 / 2 + -1,y_00,((x_00 + w_00) - (int)local_34 / 2) + 1);
      }
    }
  }
  return;
}

Assistant:

static void draw(int which, int x,int y,int w,int h, int inset, Fl_Color color)
{
  if (inset*2 >= w) inset = (w-1)/2;
  if (inset*2 >= h) inset = (h-1)/2;
  x += inset;
  y += inset;
  w -= 2*inset;
  h -= 2*inset;
  int d = w <= h ? w : h;
  if (d <= 1) return;
  fl_color(color);
  void (*f)(int,int,int,int,double,double);
  f = (which==FILL) ? fl_pie : fl_arc_i;
  if (which >= CLOSED) {
    f(x+w-d, y, d, d, w<=h ? 0 : -90, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, w<=h ? 360 : 270);
  } else if (which == UPPER_LEFT) {
    f(x+w-d, y, d, d, 45, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, 225);
  } else { // LOWER_RIGHT
    f(x, y+h-d, d, d, 225, w<=h ? 360 : 270);
    f(x+w-d, y, d, d, w<=h ? 360 : 270, 360+45);
  }
  if (which == FILL) {
    if (w < h)
      fl_rectf(x, y+d/2, w, h-(d&-2));
    else if (w > h)
      fl_rectf(x+d/2, y, w-(d&-2), h);
  } else {
    if (w < h) {
      if (which != UPPER_LEFT) fl_yxline(x+w-1, y+d/2-1, y+h-d/2+1);
      if (which != LOWER_RIGHT) fl_yxline(x, y+d/2-1, y+h-d/2+1);
    } else if (w > h) {
      if (which != UPPER_LEFT) fl_xyline(x+d/2-1, y+h-1, x+w-d/2+1);
      if (which != LOWER_RIGHT) fl_xyline(x+d/2-1, y, x+w-d/2+1);
    }
  }
}